

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void ARGBPolynomialRow_C(uint8_t *src_argb,uint8_t *dst_argb,float *poly,int width)

{
  uint32_t uVar1;
  int in_ECX;
  undefined1 *in_RSI;
  float a3;
  float r3;
  float g3;
  float b3;
  float da;
  float dr;
  float dg;
  float db;
  float a2;
  float r2;
  float g2;
  float b2;
  float a;
  float r;
  float g;
  float b;
  int i;
  int local_20;
  undefined1 *local_10;
  
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < in_ECX; local_20 = local_20 + 1) {
    uVar1 = libyuv::Clamp(0);
    *local_10 = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[1] = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[2] = (char)uVar1;
    uVar1 = libyuv::Clamp(0);
    local_10[3] = (char)uVar1;
    local_10 = local_10 + 4;
  }
  return;
}

Assistant:

void ARGBPolynomialRow_C(const uint8_t* src_argb,
                         uint8_t* dst_argb,
                         const float* poly,
                         int width) {
  int i;
  for (i = 0; i < width; ++i) {
    float b = (float)(src_argb[0]);
    float g = (float)(src_argb[1]);
    float r = (float)(src_argb[2]);
    float a = (float)(src_argb[3]);
    float b2 = b * b;
    float g2 = g * g;
    float r2 = r * r;
    float a2 = a * a;
    float db = poly[0] + poly[4] * b;
    float dg = poly[1] + poly[5] * g;
    float dr = poly[2] + poly[6] * r;
    float da = poly[3] + poly[7] * a;
    float b3 = b2 * b;
    float g3 = g2 * g;
    float r3 = r2 * r;
    float a3 = a2 * a;
    db += poly[8] * b2;
    dg += poly[9] * g2;
    dr += poly[10] * r2;
    da += poly[11] * a2;
    db += poly[12] * b3;
    dg += poly[13] * g3;
    dr += poly[14] * r3;
    da += poly[15] * a3;

    dst_argb[0] = Clamp((int32_t)(db));
    dst_argb[1] = Clamp((int32_t)(dg));
    dst_argb[2] = Clamp((int32_t)(dr));
    dst_argb[3] = Clamp((int32_t)(da));
    src_argb += 4;
    dst_argb += 4;
  }
}